

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void write_srec(char *file,char *ext,int base)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  FILE *__stream;
  long lVar4;
  ulong uVar5;
  int iVar6;
  byte bVar7;
  char *__format;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  char fname [128];
  uchar (*local_e8) [8192];
  char local_b8 [136];
  
  iVar2 = strcmp(ext,"mx");
  __format = "writing s-record file... ";
  if (iVar2 == 0) {
    __format = "writing mx file... ";
  }
  printf(__format);
  fflush(_stdout);
  strcpy(local_b8,file);
  sVar3 = strlen(local_b8);
  (local_b8 + sVar3)[0] = '.';
  (local_b8 + sVar3)[1] = '\0';
  strcat(local_b8,ext);
  __stream = fopen(local_b8,"w");
  if (__stream == (FILE *)0x0) {
    printf("can not open file \'%s\'!\n",local_b8);
  }
  else {
    if (-1 < max_bank) {
      local_e8 = rom;
      uVar5 = 0;
      iVar2 = 0;
      lVar4 = 0;
      do {
        uVar8 = 0;
        do {
          if (map[lVar4][uVar8] == 0xff) {
            bVar10 = iVar2 != 0;
          }
          else {
            if (iVar2 == 0) {
              uVar5 = uVar8 & 0xffffffff;
            }
            iVar2 = iVar2 + 1;
            bVar10 = iVar2 == 0x20;
          }
          if ((bool)((iVar2 != 0 && uVar8 == 0x1fff) | bVar10)) {
            iVar1 = (int)uVar5;
            iVar6 = (int)lVar4 * 0x2000 + base + iVar1;
            bVar7 = (char)((uint)iVar6 >> 0x10) + (char)iVar6 + (char)iVar2 +
                    (char)((uint)iVar6 >> 8) + 4;
            fprintf(__stream,"S2%02X%06X",(ulong)(iVar2 + 4));
            if (iVar2 != 0) {
              lVar9 = 0;
              do {
                bVar7 = bVar7 + (*local_e8)[lVar9 + iVar1];
                fprintf(__stream,"%02X",(ulong)(*local_e8)[lVar9 + iVar1]);
                lVar9 = lVar9 + 1;
              } while (iVar2 != (int)lVar9);
              uVar5 = (ulong)(uint)(iVar1 + (int)lVar9);
            }
            iVar2 = 0;
            fprintf(__stream,"%02X\n",(ulong)(byte)~bVar7);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != 0x2000);
        local_e8 = local_e8 + 1;
        bVar10 = lVar4 < max_bank;
        lVar4 = lVar4 + 1;
      } while (bVar10);
    }
    fprintf(__stream,"S804%06X%02X",(ulong)((map[0][0] & 0xe0) << 8),
            (ulong)(map[0][0] & 0xffffffe0 ^ 0xfb));
    fclose(__stream);
    puts("OK");
  }
  return;
}

Assistant:

void
write_srec(char *file, char *ext, int base)
{
	unsigned char data, chksum;
	char  fname[128];
	int   addr, dump, cnt, pos, i, j;
	FILE *fp;

	/* status message */
	if (!strcmp(ext, "mx"))
		printf("writing mx file... ");
	else
		printf("writing s-record file... ");

	/* flush output */
	fflush(stdout);

	/* add the file extension */
	strcpy(fname, file);
	strcat(fname, ".");
	strcat(fname, ext);

	/* open the file */
	if ((fp = fopen(fname, "w")) == NULL) {
		printf("can not open file '%s'!\n", fname);
		return;
	}

	/* dump the rom */
	dump = 0;
	cnt  = 0;
	pos  = 0;

	for (i = 0; i <= max_bank; i++) {
		for (j = 0; j < 8192; j++) {
			if (map[i][j] != 0xFF) {
				/* data byte */
				if (cnt == 0)
					pos = j;
				cnt++;
				if (cnt == 32)
					dump = 1;
			}
			else {
				/* free byte */
				if (cnt)
					dump = 1;
			}
			if (j == 8191)
				if (cnt)
					dump = 1;

			/* dump */
			if (dump) {
				dump = 0;
				addr = base + (i << 13) + pos;
				chksum = cnt + ((addr >> 16) & 0xFF) +
							   ((addr >> 8) & 0xFF) +
							   ((addr) & 0xFF) +
							   4;

				/* number, address */
				fprintf(fp, "S2%02X%06X", cnt + 4, addr);

				/* code */
				while (cnt) {
					data = rom[i][pos++];
					chksum += data;
					fprintf(fp, "%02X", data);
					cnt--;
				}

				/* chksum */
				fprintf(fp, "%02X\n", (~chksum) & 0xFF);
			}
		}
	}

	/* starting address */
	addr   = ((map[0][0] >> 5) << 13);
	chksum = ((addr >> 8) & 0xFF) + (addr & 0xFF) + 4;
	fprintf(fp, "S804%06X%02X", addr, (~chksum) & 0xFF);

	/* ok */
	fclose(fp);
	printf("OK\n");
}